

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O2

void __thiscall optimization::livevar_analyse::Livevar_Analyse::build(Livevar_Analyse *this)

{
  bool bVar1;
  long lVar2;
  sharedPtrVariableSet empty;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((this->func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    lVar2 = std::_Rb_tree_decrement
                      (&(this->func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header);
    std::
    make_shared<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>
              ();
    do {
      bVar1 = bfs_build(this,(BasicBlk *)(lVar2 + 0x28));
    } while (bVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  }
  return;
}

Assistant:

void build() {
    if (!func.basic_blks.size()) {
      return;
    }

    auto end = func.basic_blks.end();
    end--;
    sharedPtrVariableSet empty = std::make_shared<VariableSet>();
    while (bfs_build(end->second))
      ;

    // for (auto& pair : livevars) {
    //   LOG(TRACE) << pair.first << ": " << std::endl;
    //   for (auto var : *pair.second->live_vars_in) {
    //     LOG(TRACE) << var << ", ";
    //   }
    //   LOG(TRACE) << std::endl;
    //   for (auto ilv : pair.second->instLiveVars) {
    //     for (auto var : *ilv) {
    //       LOG(TRACE) << var << ", ";
    //     }
    //     LOG(TRACE) << std::endl;
    //   }
    //   LOG(TRACE) << "******************" << std::endl;
    // }
  }